

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_expression.hpp
# Opt level: O2

value_type
remora::
max<remora::vector_unary<remora::vector<double,remora::cpu_tag>,remora::device_traits<remora::cpu_tag>::abs<double>>,remora::cpu_tag>
          (vector_expression<remora::vector_unary<remora::vector<double,_remora::cpu_tag>,_remora::device_traits<remora::cpu_tag>::abs<double>_>,_remora::cpu_tag>
           *v)

{
  value_type result;
  value_type local_10;
  
  local_10 = -1.79769313486232e+308;
  bindings::
  vector_fold<remora::device_traits<remora::cpu_tag>::max<double>,remora::vector_unary<remora::vector<double,remora::cpu_tag>,remora::device_traits<remora::cpu_tag>::abs<double>>>
            (v,&local_10);
  return local_10;
}

Assistant:

typename VecV::value_type
max(vector_expression<VecV, Device> const& v) {
	typedef typename VecV::value_type value_type;
	typedef typename device_traits<Device>:: template max<value_type> functor_type;
	auto const& elem_result = eval_block(v);
	value_type result = std::numeric_limits<value_type>::lowest();
	kernels::vector_fold<functor_type>(elem_result,result);
	return result;
}